

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

boolean costly_spot(xchar x,xchar y)

{
  uint uVar1;
  level *lev;
  int iVar2;
  char *pcVar3;
  monst *mtmp;
  uint uVar4;
  
  lev = level;
  if (((level->flags).field_0x8 & 1) != 0) {
    pcVar3 = in_rooms(level,x,y,0x12);
    mtmp = shop_keeper(lev,*pcVar3);
    if ((mtmp != (monst *)0x0) && (iVar2 = inhishop(mtmp), iVar2 != 0)) {
      uVar1 = *(uint *)&level->locations[x][y].field_0x6;
      uVar4 = uVar1 >> 0x10 & 0x3f;
      if ((uVar1 >> 0x16 & 1) == 0 && 2 < uVar4) {
        if ((uVar1 & 0x3f0000) == 0) {
          return '\0';
        }
        if (level->rooms[uVar4 - 3].rtype < '\x12') {
          return '\0';
        }
        if ((char)mtmp[0x1b].movement != x) {
          return '\x01';
        }
        return *(char *)((long)&mtmp[0x1b].movement + 1) != y;
      }
    }
  }
  return '\0';
}

Assistant:

boolean costly_spot(xchar x, xchar y)
{
	struct monst *shkp;

	if (!level->flags.has_shop) return FALSE;
	shkp = shop_keeper(level, *in_rooms(level, x, y, SHOPBASE));
	if (!shkp || !inhishop(shkp)) return FALSE;

	return((boolean)(inside_shop(level, x, y) &&
		!(x == ESHK(shkp)->shk.x &&
			y == ESHK(shkp)->shk.y)));
}